

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O0

void __thiscall wasm::PassRunner::PassRunner(PassRunner *this,Module *wasm,PassOptions *options)

{
  PassOptions *options_local;
  Module *wasm_local;
  PassRunner *this_local;
  
  *(code **)this = std::__cxx11::string::string;
  *(Module **)(this + 8) = wasm;
  *(MixedArena **)(this + 0x10) = &wasm->allocator;
  std::
  vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ::vector((vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
            *)(this + 0x18));
  PassOptions::PassOptions((PassOptions *)(this + 0x30),options);
  this[0xe8] = (PassRunner)0x0;
  this[0xe9] = (PassRunner)0x0;
  return;
}

Assistant:

PassRunner(Module* wasm, PassOptions options)
    : wasm(wasm), allocator(&wasm->allocator), options(options) {}